

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::CollectMemOpInfo
          (GlobOpt *this,Instr *instrBegin,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  MemOpCandidate *this_00;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  SymID SVar6;
  undefined4 *puVar7;
  GlobOptBlockData *this_02;
  RegOpnd *pRVar8;
  Value *this_03;
  IntConstOpnd *pIVar9;
  long lVar10;
  InductionVariableChangeInfo *pIVar11;
  Type *ppMVar12;
  JITTimeFunctionBody *pJVar13;
  char16 *pcVar14;
  char16 *pcVar15;
  Opnd *pOVar16;
  StackSym *pSVar17;
  StackSym *pSVar18;
  byte local_1e9;
  Instr *local_1d0;
  byte local_189;
  SymID local_17c;
  Instr *local_178;
  Instr *prevInstr;
  Instr *__instr___1;
  char16 debugStringBuffer_1 [42];
  MemCopyCandidate *memcopyCandidate;
  MemOpCandidate *prevCandidate;
  Instr *chkInstr;
  Instr *chkInstrStop;
  Instr *__prevInstrCheck;
  InductionVariableChangeInfo inductionVariableChangeInfo_2;
  InductionVariableChangeInfo inductionVariableChangeInfo_1;
  InductionVariableChangeInfo inductionVariableChangeInfo;
  ValueInfo *pVStack_e0;
  int constValue;
  ValueInfo *vi;
  Value *val;
  Opnd *src2;
  Opnd *src1;
  StackSym *pSStack_b8;
  SymID inductionSymID;
  StackSym *sym;
  Instr *nextInstr;
  bool isInductionVar;
  bool isChangedByOne;
  Instr *pIStack_a0;
  bool isIncr;
  Instr *__instr__;
  char16 debugStringBuffer [42];
  Loop *loop;
  Value *src2Val_local;
  Value *src1Val_local;
  Instr *instr_local;
  Instr *instrBegin_local;
  GlobOpt *this_local;
  
  if (this->currentBlock->loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x86d,"(this->currentBlock->loop)","this->currentBlock->loop");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  unique0x00012000 = this->currentBlock->loop;
  bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::HasTwo
                    (&(unique0x00012000->blockList).
                      super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>);
  if (!bVar3) {
    return false;
  }
  debugStringBuffer[0x27]._1_1_ = Loop::GetLoopFlags(stack0xffffffffffffffc0);
  local_189 = 0;
  if (((byte)debugStringBuffer[0x27]._1_1_ & 1) != 0) {
    debugStringBuffer[0x27]._0_1_ = Loop::GetLoopFlags(stack0xffffffffffffffc0);
    local_189 = (byte)debugStringBuffer[0x27]._0_1_ >> 1 & 1 ^ 0xff;
  }
  if ((local_189 & 1) != 0) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
      if (!bVar3) {
        uVar4 = Func::GetSourceContextId(this->func);
        uVar5 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemSetPhase,uVar4,uVar5);
        if (!bVar3) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar5 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
          if (!bVar3) goto LAB_00582928;
        }
      }
      Output::Print(L"TRACE MemOp:");
      pJVar13 = Func::GetJITFunctionBody(this->func);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
      pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr__);
      uVar4 = Loop::GetLoopNumber(stack0xffffffffffffffc0);
      Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar4);
      Output::Print(L"minimum loop count not reached");
      pIStack_a0 = instr;
      if (instr != (Instr *)0x0) {
        IR::Instr::DumpByteCodeOffset(instr);
      }
      if (pIStack_a0 != (Instr *)0x0) {
        pcVar14 = Js::OpCodeUtil::GetOpCodeName(pIStack_a0->m_opcode);
        Output::Print(L" (%s)",pcVar14);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
LAB_00582928:
    *(ushort *)&stack0xffffffffffffffc0->field_0x178 =
         *(ushort *)&stack0xffffffffffffffc0->field_0x178 & 0xfbff;
    return false;
  }
  if ((*(ushort *)&stack0xffffffffffffffc0->field_0x178 >> 10 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x87d,"(loop->doMemOp)","loop->doMemOp");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  nextInstr._7_1_ = '\x01';
  nextInstr._6_1_ = 0;
  OVar1 = instr->m_opcode;
  if (OVar1 == LdElemI_A) {
    bVar3 = CollectMemOpLdElementI(this,instr,stack0xffffffffffffffc0);
    if (bVar3) {
      return true;
    }
    *(ushort *)&stack0xffffffffffffffc0->field_0x178 =
         *(ushort *)&stack0xffffffffffffffc0->field_0x178 & 0xfbff;
    return false;
  }
  if ((OVar1 == StElemI_A) || (OVar1 == StElemI_A_Strict)) {
    bVar3 = CollectMemOpStElementI(this,instr,stack0xffffffffffffffc0);
    if (bVar3) {
      return true;
    }
    *(ushort *)&stack0xffffffffffffffc0->field_0x178 =
         *(ushort *)&stack0xffffffffffffffc0->field_0x178 & 0xfbff;
    return false;
  }
  if (OVar1 == Add_I4) {
LAB_00582ae1:
    nextInstr._5_1_ = 0;
    sym = (StackSym *)instr->m_next;
    pOVar16 = IR::Instr::GetDst(instr);
    pSVar18 = IR::Opnd::GetStackSym(pOVar16);
    if (pSVar18 != (StackSym *)0x0) {
      pOVar16 = IR::Instr::GetDst(instr);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
      if (bVar3) {
        pOVar16 = IR::Instr::GetDst(instr);
        pSVar18 = IR::Opnd::GetStackSym(pOVar16);
        pOVar16 = IR::Instr::GetSrc1(instr);
        pSVar17 = IR::Opnd::GetStackSym(pOVar16);
        if (pSVar18 == pSVar17) {
LAB_00582c52:
          nextInstr._5_1_ = 1;
        }
        else if ((sym != (StackSym *)0x0) && (*(short *)&sym->m_tempNumberSym == 0x45)) {
          pOVar16 = IR::Instr::GetSrc1((Instr *)sym);
          bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
          if (bVar3) {
            pOVar16 = IR::Instr::GetDst((Instr *)sym);
            bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
            if (bVar3) {
              pOVar16 = IR::Instr::GetDst(instr);
              pSVar18 = IR::Opnd::GetStackSym(pOVar16);
              SVar6 = GetVarSymID(this,pSVar18);
              pOVar16 = IR::Instr::GetSrc1((Instr *)sym);
              pSVar18 = IR::Opnd::GetStackSym(pOVar16);
              if (SVar6 == (pSVar18->super_Sym).m_id) {
                pOVar16 = IR::Instr::GetSrc1(instr);
                pSVar18 = IR::Opnd::GetStackSym(pOVar16);
                SVar6 = GetVarSymID(this,pSVar18);
                pOVar16 = IR::Instr::GetDst((Instr *)sym);
                pSVar18 = IR::Opnd::GetStackSym(pOVar16);
                if (SVar6 == (pSVar18->super_Sym).m_id) goto LAB_00582c52;
              }
            }
          }
        }
      }
    }
    pOVar16 = IR::Instr::GetSrc1(instr);
    pSStack_b8 = IR::Opnd::GetStackSym(pOVar16);
    src1._4_4_ = GetVarSymID(this,pSStack_b8);
    if (((nextInstr._5_1_ & 1) != 0) &&
       (bVar3 = IsSymIDInductionVariable(this,src1._4_4_,this->currentBlock->loop), bVar3)) {
      if ((nextInstr._6_1_ & 1) == 0) {
        IR::Instr::GetSrc1(instr);
        pOVar16 = IR::Instr::GetSrc2(instr);
        bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
        if (bVar3) {
          this_02 = CurrentBlockData(this);
          pRVar8 = IR::Opnd::AsRegOpnd(pOVar16);
          this_03 = GlobOptBlockData::FindValue(this_02,&pRVar8->m_sym->super_Sym);
          if ((((this_03 != (Value *)0x0) &&
               (pVStack_e0 = ::Value::GetValueInfo(this_03), pVStack_e0 != (ValueInfo *)0x0)) &&
              (bVar3 = ValueInfo::TryGetIntConstantValue
                                 (pVStack_e0,(int32 *)((long)&__prevInstrCheck + 4),false), bVar3))
             && (__prevInstrCheck._4_4_ == 1)) {
            nextInstr._6_1_ = 1;
          }
        }
        else {
          bVar3 = IR::Opnd::IsIntConstOpnd(pOVar16);
          if (bVar3) {
            pIVar9 = IR::Opnd::AsIntConstOpnd(pOVar16);
            lVar10 = IR::EncodableOpnd<long>::GetValue(&pIVar9->super_EncodableOpnd<long>);
            if (lVar10 == 1) {
              nextInstr._6_1_ = 1;
            }
          }
        }
      }
      Loop::EnsureMemOpVariablesInitialized(stack0xffffffffffffffc0);
      if ((nextInstr._6_1_ & 1) != 0) {
        bVar3 = JsUtil::
                BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
                              (uint *)((long)&src1 + 4));
        if (!bVar3) {
          __prevInstrCheck._2_1_ = nextInstr._7_1_ << 7 | 1;
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
                (uint *)((long)&src1 + 4),
                (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 2));
          if ((pSStack_b8->super_Sym).m_id == src1._4_4_) {
            return true;
          }
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Add(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
                &(pSStack_b8->super_Sym).m_id,
                (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 2));
          return true;
        }
        memset((void *)((long)&__prevInstrCheck + 1),0,1);
        pIVar11 = JsUtil::
                  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::Lookup(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
                           (uint *)((long)&src1 + 4),
                           (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 1));
        __prevInstrCheck._1_1_ = *pIVar11;
        if (((byte)__prevInstrCheck._1_1_ & 0x7f) != 0x7f) {
          __prevInstrCheck._1_1_ =
               (InductionVariableChangeInfo)(((byte)__prevInstrCheck._1_1_ & 0x7f) + 1 & 0x7f);
        }
        __prevInstrCheck._1_1_ =
             (InductionVariableChangeInfo)
             ((byte)__prevInstrCheck._1_1_ & 0x7f | nextInstr._7_1_ << 7);
        JsUtil::
        BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
               (uint *)((long)&src1 + 4),
               (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 1));
        if ((pSStack_b8->super_Sym).m_id == src1._4_4_) {
          return true;
        }
        JsUtil::
        BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
               &(pSStack_b8->super_Sym).m_id,
               (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 1));
        return true;
      }
      __prevInstrCheck._3_1_ = 0x7f;
      bVar3 = JsUtil::
              BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
                            (uint *)((long)&src1 + 4));
      if (bVar3) {
        JsUtil::
        BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
               (uint *)((long)&src1 + 4),
               (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 3));
        if ((pSStack_b8->super_Sym).m_id == src1._4_4_) {
          return true;
        }
        JsUtil::
        BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Item(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
               &(pSStack_b8->super_Sym).m_id,
               (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 3));
        return true;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
            (uint *)((long)&src1 + 4),(InductionVariableChangeInfo *)((long)&__prevInstrCheck + 3));
      if ((pSStack_b8->super_Sym).m_id == src1._4_4_) {
        return true;
      }
      JsUtil::
      BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Add(stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap,
            &(pSStack_b8->super_Sym).m_id,
            (InductionVariableChangeInfo *)((long)&__prevInstrCheck + 3));
      return true;
    }
  }
  else if (OVar1 == Sub_I4) {
    nextInstr._7_1_ = '\0';
    goto LAB_00582ae1;
  }
  chkInstrStop = (Instr *)0x0;
  if (instr == (Instr *)0x0) {
    local_1d0 = (Instr *)0x0;
  }
  else {
    local_1d0 = instr->m_next;
  }
  for (prevCandidate = (MemOpCandidate *)instrBegin->m_next; (Instr *)prevCandidate != local_1d0;
      prevCandidate = *(MemOpCandidate **)(prevCandidate + 1)) {
    if ((chkInstrStop != (Instr *)0x0) && (chkInstrStop->m_next != (Instr *)prevCandidate)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x917,
                         "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == chkInstr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    chkInstrStop = (Instr *)prevCandidate;
    bVar3 = IsInstrInvalidForMemOp
                      (this,(Instr *)prevCandidate,stack0xffffffffffffffc0,src1Val,src2Val);
    if (bVar3) {
      *(ushort *)&stack0xffffffffffffffc0->field_0x178 =
           *(ushort *)&stack0xffffffffffffffc0->field_0x178 & 0xfbff;
      return false;
    }
    if ((stack0xffffffffffffffc0->memOpInfo != (MemOpInfo *)0x0) &&
       (bVar3 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Empty
                          ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                           stack0xffffffffffffffc0->memOpInfo->candidates), !bVar3)) {
      ppMVar12 = SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Head
                           ((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)
                            stack0xffffffffffffffc0->memOpInfo->candidates);
      this_00 = *ppMVar12;
      bVar3 = Loop::MemOpCandidate::IsMemCopy(this_00);
      if ((bVar3) &&
         ((register0x00000000 = Loop::MemOpCandidate::AsMemCopy(this_00),
          (register0x00000000->super_MemOpCandidate).base == 0xffffffff &&
          (bVar3 = IR::Instr::HasSymUse((Instr *)prevCandidate,register0x00000000->transferSym),
          bVar3)))) {
        *(ushort *)&stack0xffffffffffffffc0->field_0x178 =
             *(ushort *)&stack0xffffffffffffffc0->field_0x178 & 0xfbff;
        if ((DAT_01ec73ca & 1) != 0) {
          uVar4 = Func::GetSourceContextId(this->func);
          uVar5 = Func::GetLocalFunctionId(this->func);
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemOpPhase,uVar4,uVar5);
          if (!bVar3) {
            uVar4 = Func::GetSourceContextId(this->func);
            uVar5 = Func::GetLocalFunctionId(this->func);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,MemCopyPhase,uVar4,uVar5);
            if (!bVar3) {
              return false;
            }
          }
          Output::Print(L"TRACE MemCopy:");
          pJVar13 = Func::GetJITFunctionBody(this->func);
          pcVar14 = JITTimeFunctionBody::GetDisplayName(pJVar13);
          pcVar15 = Func::GetDebugNumberSet(this->func,(wchar (*) [42])&__instr___1);
          uVar4 = Loop::GetLoopNumber(stack0xffffffffffffffc0);
          Output::Print(0xf,L"Function: %s%s, Loop: %u: ",pcVar14,pcVar15,(ulong)uVar4);
          SVar6 = GetVarSymID(this,stack0xfffffffffffffef0->transferSym);
          Output::Print(L"Found illegal use of LdElemI value(s%d)",(ulong)SVar6);
          prevInstr = (Instr *)prevCandidate;
          if (prevCandidate != (MemOpCandidate *)0x0) {
            IR::Instr::DumpByteCodeOffset((Instr *)prevCandidate);
          }
          if (prevInstr != (Instr *)0x0) {
            pcVar14 = Js::OpCodeUtil::GetOpCodeName(prevInstr->m_opcode);
            Output::Print(L" (%s)",pcVar14);
          }
          Output::Print(L"\n");
          Output::Flush();
        }
        return false;
      }
    }
  }
  local_178 = instr->m_prev;
  pOVar16 = IR::Instr::GetDst(instr);
  local_1e9 = 1;
  if (((pOVar16 != (Opnd *)0x0) && (local_1e9 = 1, instr->m_opcode != IncrLoopBodyCount)) &&
     (local_1e9 = 1, stack0xffffffffffffffc0->memOpInfo != (MemOpInfo *)0x0)) {
    if (((instr->m_opcode == Ld_I4) && (local_178 != (Instr *)0x0)) &&
       ((local_178->m_opcode == Add_I4 ||
        ((local_178->m_opcode == Sub_I4 || (local_178->m_opcode == Ld_A)))))) {
      pOVar16 = IR::Instr::GetSrc1(instr);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
      if (bVar3) {
        pOVar16 = IR::Instr::GetDst(instr);
        bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
        if (bVar3) {
          pOVar16 = IR::Instr::GetDst(local_178);
          bVar3 = IR::Opnd::IsRegOpnd(pOVar16);
          if (bVar3) {
            pOVar16 = IR::Instr::GetDst(instr);
            pSVar18 = IR::Opnd::GetStackSym(pOVar16);
            pOVar16 = IR::Instr::GetSrc1(local_178);
            pSVar17 = IR::Opnd::GetStackSym(pOVar16);
            if (pSVar18 == pSVar17) {
              pOVar16 = IR::Instr::GetSrc1(instr);
              pSVar18 = IR::Opnd::GetStackSym(pOVar16);
              pOVar16 = IR::Instr::GetDst(local_178);
              pSVar17 = IR::Opnd::GetStackSym(pOVar16);
              local_1e9 = 1;
              if (pSVar18 == pSVar17) goto LAB_0058362a;
            }
          }
        }
      }
    }
    this_01 = stack0xffffffffffffffc0->memOpInfo->inductionVariableChangeInfoMap;
    pOVar16 = IR::Instr::GetDst(instr);
    pSVar18 = IR::Opnd::GetStackSym(pOVar16);
    local_17c = GetVarSymID(this,pSVar18);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(this_01,&local_17c);
    local_1e9 = bVar3 ^ 0xff;
  }
LAB_0058362a:
  if (((local_1e9 ^ 0xff) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x94a,
                       "(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())))"
                       ,
                       "!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo || (instr->m_opcode == Js::OpCode::Ld_I4 && prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 || prevInstr->m_opcode == Js::OpCode::Sub_I4 || prevInstr->m_opcode == Js::OpCode::Ld_A ) && instr->GetSrc1()->IsRegOpnd() && instr->GetDst()->IsRegOpnd() && prevInstr->GetDst()->IsRegOpnd() && instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() && instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) || !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym()))"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  return true;
}

Assistant:

bool
GlobOpt::CollectMemOpInfo(IR::Instr *instrBegin, IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    Assert(this->currentBlock->loop);

    Loop *loop = this->currentBlock->loop;

    if (!loop->blockList.HasTwo())
    {
        //  We support memcopy and memset for loops which have only two blocks.
        return false;
    }

    if (loop->GetLoopFlags().isInterpreted && !loop->GetLoopFlags().memopMinCountReached)
    {
        TRACE_MEMOP_VERBOSE(loop, instr, _u("minimum loop count not reached"))
        loop->doMemOp = false;
        return false;
    }
    Assert(loop->doMemOp);

    bool isIncr = true, isChangedByOne = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        if (!CollectMemOpStElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::LdElemI_A:
        if (!CollectMemOpLdElementI(instr, loop))
        {
            loop->doMemOp = false;
            return false;
        }
        break;
    case Js::OpCode::Sub_I4:
        isIncr = false;
    case Js::OpCode::Add_I4:
    {
        // The only case in which these OpCodes can contribute to an inductionVariableChangeInfo
        // is when the induction variable is being modified and overwritten aswell (ex: j = j + 1)
        // and not when the induction variable is modified but not overwritten (ex: k = j + 1).
        // This can either be detected in IR as
        // s1     = Add_I4 s1     1  // Case #1, can be seen with "j++".
        // or as
        // s4(s2) = Add_I4 s3(s1) 1  // Case #2, can be see with "j = j + 1".
        // s1     = Ld_A   s2
        bool isInductionVar = false;
        IR::Instr* nextInstr = instr->m_next;
        if (
            // Checks for Case #1 and Case #2
            instr->GetDst()->GetStackSym() != nullptr &&
            instr->GetDst()->IsRegOpnd() &&
            (
                // Checks for Case #1
                (instr->GetDst()->GetStackSym() == instr->GetSrc1()->GetStackSym()) ||

                // Checks for Case #2
                (nextInstr&& nextInstr->m_opcode == Js::OpCode::Ld_A &&
                 nextInstr->GetSrc1()->IsRegOpnd() &&
                 nextInstr->GetDst()->IsRegOpnd() &&
                 GetVarSymID(instr->GetDst()->GetStackSym()) == nextInstr->GetSrc1()->GetStackSym()->m_id &&
                 GetVarSymID(instr->GetSrc1()->GetStackSym()) == nextInstr->GetDst()->GetStackSym()->m_id)
            )
        )
        {
            isInductionVar = true;
        }
        
        // Even if dstIsInductionVar then dst == src1 so it's safe to use src1 as the induction sym always.
        StackSym* sym = instr->GetSrc1()->GetStackSym();

        SymID inductionSymID = GetVarSymID(sym);

        if (isInductionVar && IsSymIDInductionVariable(inductionSymID, this->currentBlock->loop))
        {
            if (!isChangedByOne)
            {
                IR::Opnd *src1, *src2;
                src1 = instr->GetSrc1();
                src2 = instr->GetSrc2();

                if (src2->IsRegOpnd())
                {
                    Value *val = CurrentBlockData()->FindValue(src2->AsRegOpnd()->m_sym);
                    if (val)
                    {
                        ValueInfo *vi = val->GetValueInfo();
                        int constValue;
                        if (vi && vi->TryGetIntConstantValue(&constValue))
                        {
                            if (constValue == 1)
                            {
                                isChangedByOne = true;
                            }
                        }
                    }
                }
                else if (src2->IsIntConstOpnd())
                {
                    if (src2->AsIntConstOpnd()->GetValue() == 1)
                    {
                        isChangedByOne = true;
                    }
                }
            }

            loop->EnsureMemOpVariablesInitialized();
            if (!isChangedByOne)
            {
                Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { Js::Constants::InvalidLoopUnrollFactor, 0 };

                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            else
            {
                if (!loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(inductionSymID))
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 1, isIncr };
                    loop->memOpInfo->inductionVariableChangeInfoMap->Add(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Add(sym->m_id, inductionVariableChangeInfo);
                    }
                }
                else
                {
                    Loop::InductionVariableChangeInfo inductionVariableChangeInfo = { 0, 0 };
                    inductionVariableChangeInfo = loop->memOpInfo->inductionVariableChangeInfoMap->Lookup(inductionSymID, inductionVariableChangeInfo);

                    // If inductionVariableChangeInfo.unroll has been invalidated, do
                    // not modify the Js::Constants::InvalidLoopUnrollFactor value
                    if (inductionVariableChangeInfo.unroll != Js::Constants::InvalidLoopUnrollFactor)
                    {
                        inductionVariableChangeInfo.unroll++;
                    }
                    inductionVariableChangeInfo.isIncremental = isIncr;
                    loop->memOpInfo->inductionVariableChangeInfoMap->Item(inductionSymID, inductionVariableChangeInfo);
                    if (sym->m_id != inductionSymID)
                    {
                        // Backwards pass uses this bit-vector to lookup upwardExposedUsed/bytecodeUpwardExposedUsed symbols, which are not necessarily vars.  Just add both.
                        loop->memOpInfo->inductionVariableChangeInfoMap->Item(sym->m_id, inductionVariableChangeInfo);
                    }
                }
            }
            break;
        }
        // Fallthrough if not an induction variable
    }
    default:
        FOREACH_INSTR_IN_RANGE(chkInstr, instrBegin->m_next, instr)
        {
            if (IsInstrInvalidForMemOp(chkInstr, loop, src1Val, src2Val))
            {
                loop->doMemOp = false;
                return false;
            }

            // Make sure this instruction doesn't use the memcopy transfer sym before it is checked by StElemI
            if (loop->memOpInfo && !loop->memOpInfo->candidates->Empty())
            {
                Loop::MemOpCandidate* prevCandidate = loop->memOpInfo->candidates->Head();
                if (prevCandidate->IsMemCopy())
                {
                    Loop::MemCopyCandidate* memcopyCandidate = prevCandidate->AsMemCopy();
                    if (memcopyCandidate->base == Js::Constants::InvalidSymID)
                    {
                        if (chkInstr->HasSymUse(memcopyCandidate->transferSym))
                        {
                            loop->doMemOp = false;
                            TRACE_MEMOP_PHASE_VERBOSE(MemCopy, loop, chkInstr, _u("Found illegal use of LdElemI value(s%d)"), GetVarSymID(memcopyCandidate->transferSym));
                            return false;
                        }
                    }
                }
            }
        }
        NEXT_INSTR_IN_RANGE;
        IR::Instr* prevInstr = instr->m_prev;

        // If an instr where the dst is an induction variable (and thus is being written to) is not caught by a case in the above
        // switch statement (which implies that this instr does not contributes to a inductionVariableChangeInfo) and in the default
        // case does not set doMemOp to false (which implies that this instr does not invalidate this MemOp), then FailFast as we
        // should not be performing a MemOp under these conditions. 
        AssertOrFailFast(!instr->GetDst() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || !loop->memOpInfo ||

            // Refer to "Case #2" described above in this function. For the following IR:
            // Line #1: s4(s2) = Add_I4 s3(s1) 1
            // Line #2: s3(s1) = Ld_A   s4(s2)
            // do not consider line #2 as a violating instr
            (instr->m_opcode == Js::OpCode::Ld_I4 &&
                // note Ld_A is for the case where the add was 0
                prevInstr && (prevInstr->m_opcode == Js::OpCode::Add_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Sub_I4 ||
                              prevInstr->m_opcode == Js::OpCode::Ld_A   ) &&
                instr->GetSrc1()->IsRegOpnd() &&
                instr->GetDst()->IsRegOpnd() &&
                prevInstr->GetDst()->IsRegOpnd() &&
                instr->GetDst()->GetStackSym() == prevInstr->GetSrc1()->GetStackSym() &&
                instr->GetSrc1()->GetStackSym() == prevInstr->GetDst()->GetStackSym()) ||

            !loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(GetVarSymID(instr->GetDst()->GetStackSym())));
    }

    return true;
}